

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O0

char * ngx_http_set_complex_value_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  ngx_int_t nVar2;
  undefined1 local_60 [8];
  ngx_http_compile_complex_value_t ccv;
  ngx_http_complex_value_t **cv;
  ngx_str_t *value;
  char *p;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  ccv._24_8_ = (long)conf + cmd->offset;
  if (*(long *)ccv._24_8_ == 0) {
    pvVar1 = ngx_palloc(cf->pool,0x28);
    *(void **)ccv._24_8_ = pvVar1;
    if (*(long *)ccv._24_8_ == 0) {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
    else {
      pvVar1 = cf->args->elts;
      memset(local_60,0,0x20);
      ccv.cf = (ngx_conf_t *)((long)pvVar1 + 0x10);
      ccv.value = *(ngx_str_t **)ccv._24_8_;
      local_60 = (undefined1  [8])cf;
      nVar2 = ngx_http_compile_complex_value((ngx_http_compile_complex_value_t *)local_60);
      if (nVar2 == 0) {
        cf_local = (ngx_conf_t *)0x0;
      }
      else {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

char *
ngx_http_set_complex_value_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ngx_str_t                          *value;
    ngx_http_complex_value_t          **cv;
    ngx_http_compile_complex_value_t    ccv;

    cv = (ngx_http_complex_value_t **) (p + cmd->offset);

    if (*cv != NULL) {
        return "is duplicate";
    }

    *cv = ngx_palloc(cf->pool, sizeof(ngx_http_complex_value_t));
    if (*cv == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_http_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = *cv;

    if (ngx_http_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}